

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

uchar MemGetByte(uint address)

{
  uint uVar1;
  bool bVar2;
  uchar uVar3;
  CDeviceSlot *pCVar4;
  int num;
  
  pCVar4 = (CDeviceSlot *)0x0;
  uVar3 = '\0';
  if ((DeviceID != (char *)0x0) && (pass == 3)) {
    bVar2 = 0 < Device->SlotsCount;
    if (0 < Device->SlotsCount) {
      num = 0;
      do {
        pCVar4 = CDevice::GetSlot(Device,num);
        uVar1 = pCVar4->Address;
        if ((uVar1 <= address) && (address < uVar1 + pCVar4->Size)) {
          pCVar4 = (CDeviceSlot *)(ulong)pCVar4->Page->RAM[address - uVar1];
          break;
        }
        num = num + 1;
        bVar2 = num < Device->SlotsCount;
      } while (num < Device->SlotsCount);
    }
    uVar3 = (uchar)pCVar4;
    if (!bVar2) {
      ErrorInt("MemGetByte: Error reading address",address,PASS3);
      uVar3 = '\0';
    }
  }
  return uVar3;
}

Assistant:

unsigned char MemGetByte(unsigned int address) {
	if (!DeviceID || pass != LASTPASS) {
		return 0;
	}

	CDeviceSlot* S;
	for (int i=0;i<Device->SlotsCount;i++) {
		S = Device->GetSlot(i);
		if (address >= (unsigned int)S->Address  && address < (unsigned int)S->Address + (unsigned int)S->Size) {
			return S->Page->RAM[address - S->Address];
		}
	}

	ErrorInt("MemGetByte: Error reading address", address);
	return 0;
}